

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_msg_chop_u64(nng_msg *m,uint64_t *vp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  size_t sVar10;
  void *pvVar11;
  
  sVar10 = nni_msg_len(m);
  iVar9 = 3;
  if (7 < sVar10) {
    pvVar11 = nni_msg_body(m);
    sVar10 = nni_msg_len(m);
    bVar1 = *(byte *)((long)pvVar11 + (sVar10 - 8));
    bVar2 = *(byte *)((long)pvVar11 + (sVar10 - 7));
    bVar3 = *(byte *)((long)pvVar11 + (sVar10 - 6));
    bVar4 = *(byte *)((long)pvVar11 + (sVar10 - 5));
    bVar5 = *(byte *)((long)pvVar11 + (sVar10 - 4));
    bVar6 = *(byte *)((long)pvVar11 + (sVar10 - 3));
    bVar7 = *(byte *)((long)pvVar11 + (sVar10 - 2));
    bVar8 = *(byte *)((long)pvVar11 + (sVar10 - 1));
    nni_msg_chop(m,8);
    *vp = (ulong)bVar8 +
          ((ulong)bVar7 << 8 |
          (ulong)bVar6 << 0x10 |
          (ulong)bVar5 << 0x18 |
          (ulong)bVar4 << 0x20 | (ulong)bVar3 << 0x28 | (ulong)bVar2 << 0x30 | (ulong)bVar1 << 0x38)
    ;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int
nng_msg_chop_u64(nng_msg *m, uint64_t *vp)
{
	uint8_t *body;
	uint64_t v;
	if (nni_msg_len(m) < sizeof(*vp)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	body += nni_msg_len(m);
	body -= sizeof(v);
	NNI_GET64(body, v);
	(void) nni_msg_chop(m, sizeof(v));
	*vp = v;
	return (0);
}